

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O1

void __thiscall jsonnet::internal::Desugarer::desugar(Desugarer *this,AST **ast_,uint obj_level)

{
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *params;
  int iVar1;
  AST **ppAVar2;
  pointer pCVar3;
  bool bVar4;
  long lVar5;
  ArrayComprehension *ast;
  AST *pAVar6;
  Object *ast_00;
  ObjectComprehension *ast_01;
  Conditional *pCVar7;
  Var *pVVar8;
  undefined8 uVar9;
  Apply *pAVar10;
  Function *pFVar11;
  Binary *pBVar12;
  LiteralString *pLVar13;
  ostream *poVar14;
  StaticError *this_00;
  AST **ppAVar15;
  Field *field;
  pointer pCVar16;
  long lVar17;
  long *plVar18;
  Bind *bind;
  pointer *args_2;
  long lVar19;
  Fodder *this_01;
  initializer_list<jsonnet::internal::ArgParam> __l;
  initializer_list<jsonnet::internal::ArgParam> __l_00;
  bool local_20c;
  bool local_20b;
  bool local_20a;
  allocator_type local_209;
  LocationRange *local_208;
  Index *local_200;
  Var *local_1f8;
  undefined1 local_1f0 [32];
  AST **local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> local_1b8;
  LiteralString *local_1a0;
  undefined1 local_198 [16];
  Identifier local_188 [2];
  ArgParam local_140;
  ArgParam local_e8;
  ArgParam local_90;
  void *local_38;
  
  while( true ) {
    pAVar6 = *ast_;
    if (pAVar6 == (AST *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Apply::typeinfo,0);
    }
    if (lVar5 != 0) {
      desugar(this,(AST **)(lVar5 + 0x80),obj_level);
      lVar17 = *(long *)(lVar5 + 0xa8);
      for (lVar5 = *(long *)(lVar5 + 0xa0); lVar5 != lVar17; lVar5 = lVar5 + 0x58) {
        desugar(this,(AST **)(lVar5 + 0x38),obj_level);
      }
      return;
    }
    if (pAVar6 == (AST *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&ApplyBrace::typeinfo,0);
    }
    if (lVar5 != 0) {
      desugar(this,(AST **)(lVar5 + 0x80),obj_level);
      desugar(this,(AST **)(lVar5 + 0x88),obj_level);
      local_198._0_4_ = 3;
      pBVar12 = Allocator::
                make<jsonnet::internal::Binary,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::BinaryOp,jsonnet::internal::AST*&>
                          (this->alloc,(LocationRange *)(lVar5 + 8),
                           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            *)(lVar5 + 0x50),(AST **)(lVar5 + 0x80),
                           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            *)EF,(BinaryOp *)local_198,(AST **)(lVar5 + 0x88));
      goto LAB_001ef251;
    }
    if (pAVar6 == (AST *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Array::typeinfo,0);
    }
    if (lVar5 != 0) {
      ppAVar2 = *(AST ***)(lVar5 + 0x88);
      for (ppAVar15 = *(AST ***)(lVar5 + 0x80); ppAVar15 != ppAVar2; ppAVar15 = ppAVar15 + 4) {
        desugar(this,ppAVar15,obj_level);
      }
      return;
    }
    if (pAVar6 == (AST *)0x0) {
      ast = (ArrayComprehension *)0x0;
    }
    else {
      ast = (ArrayComprehension *)
            __dynamic_cast(pAVar6,&AST::typeinfo,&ArrayComprehension::typeinfo,0);
    }
    if (ast != (ArrayComprehension *)0x0) break;
    if (pAVar6 == (AST *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Assert::typeinfo,0);
    }
    if (lVar5 != 0) {
      local_208 = (LocationRange *)ast_;
      desugar(this,(AST **)(lVar5 + 0x80),obj_level);
      ppAVar15 = (AST **)(lVar5 + 0xa0);
      if (*(long *)(lVar5 + 0xa0) == 0) {
        local_198._0_8_ = local_188;
        ::std::__cxx11::u32string::_M_construct<char32_t_const*>
                  ((u32string *)local_198,L"Assertion failed.",L"");
        local_1f0._0_4_ = 5;
        pLVar13 = Allocator::
                  make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::__cxx11::u32string_const&,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                            (this->alloc,(LocationRange *)E,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF,(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                    *)local_198,(TokenKind *)local_1f0,(char (*) [1])0x2647dd,
                             (char (*) [1])0x2647dd);
        *ppAVar15 = &pLVar13->super_AST;
        if ((Identifier *)local_198._0_8_ != local_188) {
          operator_delete((void *)local_198._0_8_,(long)local_188[0].name._M_dataplus._M_p * 4 + 4);
        }
      }
      desugar(this,ppAVar15,obj_level);
      desugar(this,(AST **)(lVar5 + 0xc0),obj_level);
      local_198._0_8_ =
           Allocator::
           make<jsonnet::internal::Error,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&>
                     (this->alloc,(LocationRange *)(lVar5 + 8),
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,ppAVar15);
      pCVar7 = Allocator::
               make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&>
                         (this->alloc,(LocationRange *)(lVar5 + 8),
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)(lVar5 + 0x50),(AST **)(lVar5 + 0x80),
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,(AST **)(lVar5 + 0xc0),
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,(AST **)local_198);
      *(Conditional **)local_208 = pCVar7;
      return;
    }
    if (pAVar6 == (AST *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Binary::typeinfo,0);
    }
    if (lVar5 != 0) {
      desugar(this,(AST **)(lVar5 + 0x80),obj_level);
      desugar(this,(AST **)(lVar5 + 0xa8),obj_level);
      iVar1 = *(int *)(lVar5 + 0xa0);
      if (iVar1 == 0xd) {
        bVar4 = true;
      }
      else {
        if (iVar1 != 0xc) {
          if (iVar1 != 2) {
            return;
          }
          local_1f0._0_8_ = std(this);
          local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
          local_198._0_8_ = local_188;
          ::std::__cxx11::u32string::_M_construct<char32_t_const*>
                    ((u32string *)local_198,L"mod",L"");
          local_1f8 = (Var *)CONCAT44(local_1f8._4_4_,5);
          local_200 = (Index *)Allocator::
                               make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::__cxx11::u32string_const&,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                                         (this->alloc,(LocationRange *)E,
                                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                           *)EF,(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                                 *)local_198,(TokenKind *)&local_1f8,
                                          (char (*) [1])0x2647dd,(char (*) [1])0x2647dd);
          local_1f8 = (Var *)0x0;
          local_1a0 = (LiteralString *)0x0;
          local_1b8.
          super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)Allocator::
                        make<jsonnet::internal::Index,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool,jsonnet::internal::LiteralString*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                                  (this->alloc,(LocationRange *)E,
                                   (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                    *)EF,(Var **)local_1f0,
                                   (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                    *)EF,(bool *)local_1c8._M_local_buf,(LiteralString **)&local_200
                                   ,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                     *)EF,&local_1f8,
                                   (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                    *)EF,&local_1a0,
                                   (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                    *)EF);
          if ((Identifier *)local_198._0_8_ != local_188) {
            operator_delete((void *)local_198._0_8_,(long)local_188[0].name._M_dataplus._M_p * 4 + 4
                           );
          }
          ArgParam::ArgParam((ArgParam *)local_198,*(AST **)(lVar5 + 0x80),(Fodder *)EF);
          ArgParam::ArgParam(&local_140,*(AST **)(lVar5 + 0xa8),(Fodder *)EF);
          __l._M_len = 2;
          __l._M_array = (iterator)local_198;
          ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
          vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                  *)local_1f0,__l,(allocator_type *)&local_200);
          lVar17 = -0xb0;
          this_01 = &local_140.commaFodder;
          do {
            ::std::
            vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            ::~vector(this_01);
            ::std::
            vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)((long)(this_01 + -2) + 0x10));
            ::std::
            vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)((long)(this_01 + -3) + 8));
            this_01 = (Fodder *)((long)(this_01 + -4) + 8);
            lVar17 = lVar17 + 0x58;
          } while (lVar17 != 0);
          local_198._0_8_ = local_198._0_8_ & 0xffffffffffffff00;
          local_200 = (Index *)((ulong)local_200 & 0xffffffffffffff00);
          pAVar10 = Allocator::
                    make<jsonnet::internal::Apply,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>&,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                              (this->alloc,(LocationRange *)(lVar5 + 8),
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)(lVar5 + 0x50),(AST **)&local_1b8,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,(vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                                      *)local_1f0,(bool *)local_198,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                      *)EF,(bool *)&local_200);
          *ast_ = &pAVar10->super_AST;
          ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
          ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                   *)local_1f0);
          return;
        }
        bVar4 = false;
      }
      pAVar10 = equals(this,(LocationRange *)(lVar5 + 8),*(AST **)(lVar5 + 0x80),
                       *(AST **)(lVar5 + 0xa8));
      *ast_ = &pAVar10->super_AST;
      if (!bVar4) {
        return;
      }
      local_198._0_8_ = (ulong)(uint)local_198._4_4_ << 0x20;
      pBVar12 = (Binary *)
                Allocator::
                make<jsonnet::internal::Unary,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::UnaryOp,jsonnet::internal::AST*&>
                          (this->alloc,(LocationRange *)(lVar5 + 8),
                           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            *)(lVar5 + 0x50),(UnaryOp *)local_198,ast_);
      goto LAB_001ef251;
    }
    if (pAVar6 == (AST *)0x0) {
LAB_001eed67:
      lVar5 = 0;
    }
    else {
      lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&BuiltinFunction::typeinfo,0);
      if (lVar5 != 0) {
        return;
      }
      if (pAVar6 == (AST *)0x0) goto LAB_001eed67;
      lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Conditional::typeinfo,0);
    }
    if (lVar5 == 0) {
      if (pAVar6 == (AST *)0x0) {
        lVar5 = 0;
      }
      else {
        lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Dollar::typeinfo,0);
      }
      if (lVar5 != 0) {
        if (obj_level == 0) {
          this_00 = (StaticError *)__cxa_allocate_exception(0x60);
          local_198._0_8_ = local_188;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_198,"No top-level object found.","");
          StaticError::StaticError(this_00,(LocationRange *)(lVar5 + 8),(string *)local_198);
          __cxa_throw(this_00,&StaticError::typeinfo,StaticError::~StaticError);
        }
        local_198._0_8_ = local_188;
        ::std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)local_198,L"$",L"");
        local_1f0._0_8_ = Allocator::makeIdentifier(this->alloc,(UString *)local_198);
        pVVar8 = Allocator::
                 make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                           (this->alloc,(LocationRange *)E,
                            (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)EF,(Identifier **)local_1f0);
        *ast_ = &pVVar8->super_AST;
        pVVar8 = (Var *)local_198._0_8_;
        if ((Identifier *)local_198._0_8_ == local_188) {
          return;
        }
        goto LAB_001ef628;
      }
      if (pAVar6 == (AST *)0x0) {
        lVar5 = 0;
      }
      else {
        lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Error::typeinfo,0);
      }
      if (lVar5 == 0) {
        if (pAVar6 == (AST *)0x0) {
          lVar5 = 0;
        }
        else {
          lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Function::typeinfo,0);
        }
        if (lVar5 != 0) {
          desugar(this,(AST **)(lVar5 + 0xd0),obj_level);
          desugarParams(this,(ArgParams *)(lVar5 + 0x98),obj_level);
          return;
        }
        if (pAVar6 == (AST *)0x0) {
          lVar5 = 0;
        }
        else {
          lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Import::typeinfo,0);
        }
        if (lVar5 != 0) {
          local_198._0_8_ = *(long *)(lVar5 + 0x80);
          desugar(this,(AST **)local_198,obj_level);
joined_r0x001ef6f1:
          if ((pointer)local_198._0_8_ == (pointer)0x0) {
            uVar9 = 0;
          }
          else {
            uVar9 = __dynamic_cast(local_198._0_8_,&AST::typeinfo,&LiteralString::typeinfo,0);
          }
          *(undefined8 *)(lVar5 + 0x80) = uVar9;
          return;
        }
        if (pAVar6 == (AST *)0x0) {
          lVar5 = 0;
        }
        else {
          lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Importstr::typeinfo,0);
        }
        if (lVar5 != 0) {
          local_198._0_8_ = *(long *)(lVar5 + 0x80);
          desugar(this,(AST **)local_198,obj_level);
          goto joined_r0x001ef6f1;
        }
        if (pAVar6 == (AST *)0x0) {
          lVar5 = 0;
        }
        else {
          lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Importbin::typeinfo,0);
        }
        if (lVar5 != 0) {
          local_198._0_8_ = *(long *)(lVar5 + 0x80);
          desugar(this,(AST **)local_198,obj_level);
          goto joined_r0x001ef6f1;
        }
        if (pAVar6 == (AST *)0x0) {
          lVar5 = 0;
        }
        else {
          lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&InSuper::typeinfo,0);
        }
        if (lVar5 != 0) goto LAB_001eeeda;
        if (pAVar6 == (AST *)0x0) {
          lVar5 = 0;
        }
        else {
          lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Index::typeinfo,0);
        }
        if (lVar5 != 0) {
          desugar(this,(AST **)(lVar5 + 0x80),obj_level);
          if (*(char *)(lVar5 + 0xa0) != '\x01') {
            if (*(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> **)
                 (lVar5 + 0x108) !=
                (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)0x0
               ) {
              if (*(long *)(lVar5 + 0xa8) != 0) {
                __assert_fail("ast->index == nullptr",
                              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/desugarer.cpp"
                              ,0x33a,
                              "void jsonnet::internal::Desugarer::desugar(AST *&, unsigned int)");
              }
              local_198._0_4_ = 5;
              pLVar13 = Allocator::
                        make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::__cxx11::u32string_const&,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                                  (this->alloc,(LocationRange *)E,
                                   (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                    *)EF,*(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                           **)(lVar5 + 0x108),(TokenKind *)local_198,
                                   (char (*) [1])0x2647dd,(char (*) [1])0x2647dd);
              *(LiteralString **)(lVar5 + 0xa8) = pLVar13;
              *(undefined8 *)(lVar5 + 0x108) = 0;
            }
            ppAVar15 = (AST **)(lVar5 + 0xa8);
            goto LAB_001efcfa;
          }
          ppAVar15 = (AST **)(lVar5 + 0xa8);
          if (*(long *)(lVar5 + 0xa8) == 0) {
            pAVar6 = &Allocator::
                      make<jsonnet::internal::LiteralNull,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                                (this->alloc,(LocationRange *)E,
                                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                  *)EF)->super_AST;
            *ppAVar15 = pAVar6;
          }
          desugar(this,ppAVar15,obj_level);
          local_208 = (LocationRange *)(lVar5 + 200);
          if (*(long *)(lVar5 + 200) == 0) {
            pAVar6 = &Allocator::
                      make<jsonnet::internal::LiteralNull,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                                (this->alloc,(LocationRange *)E,
                                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                  *)EF)->super_AST;
            *(AST **)local_208 = pAVar6;
          }
          desugar(this,(AST **)local_208,obj_level);
          local_1d0 = (AST **)(lVar5 + 0xe8);
          if (*(long *)(lVar5 + 0xe8) == 0) {
            pAVar6 = &Allocator::
                      make<jsonnet::internal::LiteralNull,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                                (this->alloc,(LocationRange *)E,
                                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                  *)EF)->super_AST;
            *local_1d0 = pAVar6;
          }
          local_1c8._8_8_ = ppAVar15;
          desugar(this,local_1d0,obj_level);
          local_1f8 = std(this);
          local_20c = false;
          local_1f0._0_8_ = local_1f0 + 0x10;
          ::std::__cxx11::u32string::_M_construct<char32_t_const*>
                    ((u32string *)local_1f0,L"slice",L"");
          local_198._0_4_ = 5;
          local_1a0 = Allocator::
                      make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::__cxx11::u32string_const&,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                                (this->alloc,(LocationRange *)E,
                                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                  *)EF,(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                        *)local_1f0,(TokenKind *)local_198,(char (*) [1])0x2647dd,
                                 (char (*) [1])0x2647dd);
          local_1c8._M_allocated_capacity = 0;
          local_38 = (void *)0x0;
          local_200 = Allocator::
                      make<jsonnet::internal::Index,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool,jsonnet::internal::LiteralString*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                                (this->alloc,(LocationRange *)E,
                                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                  *)EF,&local_1f8,
                                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                  *)EF,&local_20c,&local_1a0,
                                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                  *)EF,(void **)&local_1c8._M_allocated_capacity,
                                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                  *)EF,&local_38,
                                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                  *)EF);
          ArgParam::ArgParam((ArgParam *)local_198,*(AST **)(lVar5 + 0x80),(Fodder *)EF);
          ArgParam::ArgParam(&local_140,*(AST **)local_1c8._8_8_,(Fodder *)EF);
          ArgParam::ArgParam(&local_e8,*(AST **)local_208,(Fodder *)EF);
          ArgParam::ArgParam(&local_90,*local_1d0,(Fodder *)EF);
          __l_00._M_len = 4;
          __l_00._M_array = (iterator)local_198;
          ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
          vector(&local_1b8,__l_00,&local_209);
          local_20a = false;
          local_20b = false;
          pAVar10 = Allocator::
                    make<jsonnet::internal::Apply,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Index*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                              (this->alloc,(LocationRange *)(lVar5 + 8),
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,&local_200,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,&local_1b8,&local_20a,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                      *)EF,&local_20b);
          *ast_ = &pAVar10->super_AST;
          ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
          ~vector(&local_1b8);
          lVar5 = 0x108;
          do {
            ArgParam::~ArgParam((ArgParam *)(local_198 + lVar5));
            lVar5 = lVar5 + -0x58;
          } while (lVar5 != -0x58);
          local_188[0].name._M_dataplus._M_p = (pointer)local_1f0._16_8_;
          pVVar8 = (Var *)local_1f0._0_8_;
          if ((Var *)local_1f0._0_8_ == (Var *)(local_1f0 + 0x10)) {
            return;
          }
LAB_001ef628:
          operator_delete(pVVar8,(long)local_188[0].name._M_dataplus._M_p * 4 + 4);
          return;
        }
        if (pAVar6 == (AST *)0x0) {
          lVar5 = 0;
        }
        else {
          lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Local::typeinfo,0);
        }
        if (lVar5 != 0) {
          lVar19 = *(long *)(lVar5 + 0x88);
          for (lVar17 = *(long *)(lVar5 + 0x80); lVar17 != lVar19; lVar17 = lVar17 + 0xb0) {
            desugar(this,(AST **)(lVar17 + 0x38),obj_level);
          }
          desugar(this,(AST **)(lVar5 + 0x98),obj_level);
          lVar17 = *(long *)(lVar5 + 0x88);
          if (*(long *)(lVar5 + 0x80) == lVar17) {
            return;
          }
          local_208 = (LocationRange *)(lVar5 + 8);
          args_2 = (pointer *)(*(long *)(lVar5 + 0x80) + 0x48);
          do {
            if (*(char *)(args_2 + -1) == '\x01') {
              params = (vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                        *)(args_2 + 3);
              desugarParams(this,params,obj_level);
              local_198._0_8_ = local_198._0_8_ & 0xffffffffffffff00;
              pFVar11 = Allocator::
                        make<jsonnet::internal::Function,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>&,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&>
                                  (this->alloc,local_208,
                                   (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                    *)(lVar5 + 0x50),
                                   (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                    *)args_2,params,(bool *)local_198,
                                   (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                    *)(args_2 + 7),(AST **)(args_2 + -2));
              args_2[-2] = (pointer)pFVar11;
              *(undefined1 *)(args_2 + -1) = 0;
              ::std::
              vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
              _M_erase_at_end(params,(pointer)(((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                                 *)(args_2 + 3))->
                                              super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                              )._M_impl.super__Vector_impl_data._M_start);
            }
            lVar19 = (long)(args_2 + 0xd);
            args_2 = args_2 + 0x16;
          } while (lVar19 != lVar17);
          return;
        }
        if (pAVar6 == (AST *)0x0) {
LAB_001eef9a:
          lVar5 = 0;
        }
        else {
          lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&LiteralBoolean::typeinfo,0);
          if (lVar5 != 0) {
            return;
          }
          if (pAVar6 == (AST *)0x0) goto LAB_001eef9a;
          lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&LiteralNumber::typeinfo,0);
          if (lVar5 != 0) {
            return;
          }
          if (pAVar6 == (AST *)0x0) goto LAB_001eef9a;
          lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&LiteralString::typeinfo,0);
        }
        if (lVar5 != 0) {
          if (3 < *(int *)(lVar5 + 0xa0) - 2U) {
            jsonnet_string_unescape
                      ((UString *)local_198,(LocationRange *)(lVar5 + 8),
                       (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                        *)(lVar5 + 0x80));
            ::std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::operator=
                      ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                        *)(lVar5 + 0x80),(UString *)local_198);
            if ((Identifier *)local_198._0_8_ != local_188) {
              operator_delete((void *)local_198._0_8_,
                              (long)local_188[0].name._M_dataplus._M_p * 4 + 4);
            }
          }
          *(undefined4 *)(lVar5 + 0xa0) = 5;
          *(undefined8 *)(lVar5 + 0xb0) = 0;
          **(undefined1 **)(lVar5 + 0xa8) = 0;
          return;
        }
        if (pAVar6 == (AST *)0x0) {
LAB_001eefe5:
          lVar5 = 0;
        }
        else {
          lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&LiteralNull::typeinfo,0);
          if (lVar5 != 0) {
            return;
          }
          if (pAVar6 == (AST *)0x0) goto LAB_001eefe5;
          lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&DesugaredObject::typeinfo,0);
        }
        if (lVar5 != 0) {
          lVar17 = *(long *)(lVar5 + 0x98);
          lVar19 = *(long *)(lVar5 + 0xa0);
          if (lVar17 != lVar19) {
            do {
              desugar(this,(AST **)(lVar17 + 8),obj_level);
              desugar(this,(AST **)(lVar17 + 0x10),obj_level + 1);
              lVar17 = lVar17 + 0x18;
            } while (lVar17 != lVar19);
          }
          plVar18 = *(long **)(lVar5 + 0x80);
          if (plVar18 == (long *)(lVar5 + 0x80)) {
            return;
          }
          do {
            local_198._0_8_ = plVar18[2];
            desugar(this,(AST **)local_198,obj_level + 1);
            plVar18 = (long *)*plVar18;
          } while (plVar18 != (long *)(lVar5 + 0x80));
          return;
        }
        if (pAVar6 == (AST *)0x0) {
          ast_00 = (Object *)0x0;
        }
        else {
          ast_00 = (Object *)__dynamic_cast(pAVar6,&AST::typeinfo,&Object::typeinfo,0);
        }
        if (ast_00 != (Object *)0x0) {
          pBVar12 = (Binary *)makeObject(this,ast_00,obj_level);
          goto LAB_001ef251;
        }
        if (pAVar6 == (AST *)0x0) {
          ast_01 = (ObjectComprehension *)0x0;
        }
        else {
          ast_01 = (ObjectComprehension *)
                   __dynamic_cast(pAVar6,&AST::typeinfo,&ObjectComprehension::typeinfo,0);
        }
        if (ast_01 != (ObjectComprehension *)0x0) {
          pBVar12 = (Binary *)makeObjectComprehension(this,ast_01,obj_level);
          goto LAB_001ef251;
        }
        if (pAVar6 == (AST *)0x0) {
          lVar5 = 0;
        }
        else {
          lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&ObjectComprehensionSimple::typeinfo,0);
        }
        if (lVar5 == 0) {
          if (pAVar6 == (AST *)0x0) {
            lVar5 = 0;
          }
          else {
            lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Parens::typeinfo,0);
          }
          if (lVar5 != 0) {
            desugar(this,(AST **)(lVar5 + 0x80),obj_level);
            pBVar12 = *(Binary **)(lVar5 + 0x80);
            goto LAB_001ef251;
          }
          if (pAVar6 == (AST *)0x0) {
LAB_001ef0fe:
            lVar5 = 0;
          }
          else {
            lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Self::typeinfo,0);
            if (lVar5 != 0) {
              return;
            }
            if (pAVar6 == (AST *)0x0) goto LAB_001ef0fe;
            lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&SuperIndex::typeinfo,0);
          }
          if (lVar5 != 0) {
            if (*(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> **)
                 (lVar5 + 0xb8) !=
                (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)0x0
               ) {
              if (*(long *)(lVar5 + 0x98) != 0) {
                __assert_fail("ast->index == nullptr",
                              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/desugarer.cpp"
                              ,0x386,
                              "void jsonnet::internal::Desugarer::desugar(AST *&, unsigned int)");
              }
              local_198._0_4_ = 5;
              pLVar13 = Allocator::
                        make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::__cxx11::u32string_const&,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                                  (this->alloc,(LocationRange *)E,
                                   (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                    *)EF,*(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                           **)(lVar5 + 0xb8),(TokenKind *)local_198,
                                   (char (*) [1])0x2647dd,(char (*) [1])0x2647dd);
              *(LiteralString **)(lVar5 + 0x98) = pLVar13;
              *(undefined8 *)(lVar5 + 0xb8) = 0;
            }
            ppAVar15 = (AST **)(lVar5 + 0x98);
LAB_001efcfa:
            desugar(this,ppAVar15,obj_level);
            return;
          }
          if (pAVar6 == (AST *)0x0) {
            lVar5 = 0;
          }
          else {
            lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Unary::typeinfo,0);
          }
          if (lVar5 == 0) {
            if ((pAVar6 != (AST *)0x0) &&
               (lVar5 = __dynamic_cast(pAVar6,&AST::typeinfo,&Var::typeinfo,0), lVar5 != 0)) {
              return;
            }
            poVar14 = ::std::operator<<((ostream *)&::std::cerr,"INTERNAL ERROR: Unknown AST: ");
            poVar14 = (ostream *)::std::ostream::operator<<(poVar14,*ast_);
            ::std::endl<char,std::char_traits<char>>(poVar14);
            abort();
          }
          ast_ = (AST **)(lVar5 + 0x88);
        }
        else {
          desugar(this,(AST **)(lVar5 + 0x80),obj_level);
          desugar(this,(AST **)(lVar5 + 0x88),obj_level + 1);
          ast_ = (AST **)(lVar5 + 0x98);
        }
      }
      else {
LAB_001eeeda:
        ast_ = (AST **)(lVar5 + 0x80);
      }
    }
    else {
      desugar(this,(AST **)(lVar5 + 0x80),obj_level);
      desugar(this,(AST **)(lVar5 + 0xa0),obj_level);
      ast_ = (AST **)(lVar5 + 0xc0);
      if (*(long *)(lVar5 + 0xc0) == 0) {
        pAVar6 = &Allocator::
                  make<jsonnet::internal::LiteralNull,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                            (this->alloc,(LocationRange *)E,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF)->super_AST;
        *ast_ = pAVar6;
      }
    }
  }
  pCVar3 = (ast->specs).
           super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pCVar16 = (ast->specs).
                 super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                 ._M_impl.super__Vector_impl_data._M_start; pCVar16 != pCVar3; pCVar16 = pCVar16 + 1
      ) {
    desugar(this,&pCVar16->expr,obj_level);
  }
  desugar(this,&ast->body,obj_level + 1);
  pBVar12 = (Binary *)makeArrayComprehension(this,ast);
LAB_001ef251:
  *ast_ = &pBVar12->super_AST;
  return;
}

Assistant:

void desugar(AST *&ast_, unsigned obj_level)
    {
        if (auto *ast = dynamic_cast<Apply *>(ast_)) {
            desugar(ast->target, obj_level);
            for (ArgParam &arg : ast->args)
                desugar(arg.expr, obj_level);

        } else if (auto *ast = dynamic_cast<ApplyBrace *>(ast_)) {
            desugar(ast->left, obj_level);
            desugar(ast->right, obj_level);
            ast_ =
                make<Binary>(ast->location, ast->openFodder, ast->left, EF, BOP_PLUS, ast->right);

        } else if (auto *ast = dynamic_cast<Array *>(ast_)) {
            for (auto &el : ast->elements)
                desugar(el.expr, obj_level);

        } else if (auto *ast = dynamic_cast<ArrayComprehension *>(ast_)) {
            for (ComprehensionSpec &spec : ast->specs)
                desugar(spec.expr, obj_level);
            desugar(ast->body, obj_level + 1);

            ast_ = makeArrayComprehension(ast);

        } else if (auto *ast = dynamic_cast<Assert *>(ast_)) {
            desugar(ast->cond, obj_level);
            if (ast->message == nullptr) {
                ast->message = str(U"Assertion failed.");
            }
            desugar(ast->message, obj_level);
            desugar(ast->rest, obj_level);

            // if cond then rest else error msg
            AST *branch_false = make<Error>(ast->location, EF, ast->message);
            ast_ = make<Conditional>(
                ast->location, ast->openFodder, ast->cond, EF, ast->rest, EF, branch_false);

        } else if (auto *ast = dynamic_cast<Binary *>(ast_)) {
            desugar(ast->left, obj_level);
            desugar(ast->right, obj_level);

            bool invert = false;

            switch (ast->op) {
                case BOP_PERCENT: {
                    AST *f_mod = make<Index>(
                        E, EF, std(), EF, false, str(U"mod"), EF, nullptr, EF, nullptr, EF);
                    ArgParams args = {{ast->left, EF}, {ast->right, EF}};
                    ast_ = make<Apply>(
                        ast->location, ast->openFodder, f_mod, EF, args, false, EF, EF, false);
                } break;

                case BOP_MANIFEST_UNEQUAL: invert = true;
                [[fallthrough]];
                case BOP_MANIFEST_EQUAL: {
                    ast_ = equals(ast->location, ast->left, ast->right);
                    if (invert)
                        ast_ = make<Unary>(ast->location, ast->openFodder, UOP_NOT, ast_);
                } break;

                default:;
                    // Otherwise don't change it.
            }

        } else if (dynamic_cast<const BuiltinFunction *>(ast_)) {
            // Nothing to do.

        } else if (auto *ast = dynamic_cast<Conditional *>(ast_)) {
            desugar(ast->cond, obj_level);
            desugar(ast->branchTrue, obj_level);
            if (ast->branchFalse == nullptr)
                ast->branchFalse = null();
            desugar(ast->branchFalse, obj_level);

        } else if (auto *ast = dynamic_cast<Dollar *>(ast_)) {
            if (obj_level == 0) {
                throw StaticError(ast->location, "No top-level object found.");
            }
            ast_ = var(id(U"$"));

        } else if (auto *ast = dynamic_cast<Error *>(ast_)) {
            desugar(ast->expr, obj_level);

        } else if (auto *ast = dynamic_cast<Function *>(ast_)) {
            desugar(ast->body, obj_level);
            desugarParams(ast->params, obj_level);

        } else if (auto *ast = dynamic_cast<Import *>(ast_)) {
            // TODO(dcunnin): Abstract this into a template function if it becomes more common.
            AST *file = ast->file;
            desugar(file, obj_level);
            ast->file = dynamic_cast<LiteralString *>(file);

        } else if (auto *ast = dynamic_cast<Importstr *>(ast_)) {
            // TODO(dcunnin): Abstract this into a template function if it becomes more common.
            AST *file = ast->file;
            desugar(file, obj_level);
            ast->file = dynamic_cast<LiteralString *>(file);

        } else if (auto *ast = dynamic_cast<Importbin *>(ast_)) {
            // TODO(dcunnin): Abstract this into a template function if it becomes more common.
            AST *file = ast->file;
            desugar(file, obj_level);
            ast->file = dynamic_cast<LiteralString *>(file);

        } else if (auto *ast = dynamic_cast<InSuper *>(ast_)) {
            desugar(ast->element, obj_level);

        } else if (auto *ast = dynamic_cast<Index *>(ast_)) {
            desugar(ast->target, obj_level);
            if (ast->isSlice) {
                if (ast->index == nullptr)
                    ast->index = null();
                desugar(ast->index, obj_level);

                if (ast->end == nullptr)
                    ast->end = null();
                desugar(ast->end, obj_level);

                if (ast->step == nullptr)
                    ast->step = null();
                desugar(ast->step, obj_level);

                ast_ = make<Apply>(
                    ast->location,
                    EF,
                    make<Index>(
                        E, EF, std(), EF, false, str(U"slice"), EF, nullptr, EF, nullptr, EF),
                    EF,
                    ArgParams{
                        {ast->target, EF},
                        {ast->index, EF},
                        {ast->end, EF},
                        {ast->step, EF},
                    },
                    false,  // trailing comma
                    EF,
                    EF,
                    false  // tailstrict
                );
            } else {
                if (ast->id != nullptr) {
                    assert(ast->index == nullptr);
                    ast->index = str(ast->id->name);
                    ast->id = nullptr;
                }
                desugar(ast->index, obj_level);
            }

        } else if (auto *ast = dynamic_cast<Local *>(ast_)) {
            for (auto &bind : ast->binds)
                desugar(bind.body, obj_level);
            desugar(ast->body, obj_level);

            for (auto &bind : ast->binds) {
                if (bind.functionSugar) {
                    desugarParams(bind.params, obj_level);
                    bind.body = make<Function>(ast->location,
                                               ast->openFodder,
                                               bind.parenLeftFodder,
                                               bind.params,
                                               false,
                                               bind.parenRightFodder,
                                               bind.body);
                    bind.functionSugar = false;
                    bind.params.clear();
                }
            }

        } else if (dynamic_cast<const LiteralBoolean *>(ast_)) {
            // Nothing to do.

        } else if (dynamic_cast<const LiteralNumber *>(ast_)) {
            // Nothing to do.

        } else if (auto *ast = dynamic_cast<LiteralString *>(ast_)) {
            if ((ast->tokenKind != LiteralString::RAW_DESUGARED) &&
                (ast->tokenKind != LiteralString::BLOCK) &&
                (ast->tokenKind != LiteralString::VERBATIM_DOUBLE) &&
                (ast->tokenKind != LiteralString::VERBATIM_SINGLE)) {
                ast->value = jsonnet_string_unescape(ast->location, ast->value);
            }
            ast->tokenKind = LiteralString::RAW_DESUGARED;
            ast->blockIndent.clear();

        } else if (dynamic_cast<const LiteralNull *>(ast_)) {
            // Nothing to do.

        } else if (auto *ast = dynamic_cast<DesugaredObject *>(ast_)) {
            for (auto &field : ast->fields) {
                desugar(field.name, obj_level);
                desugar(field.body, obj_level + 1);
            }
            for (AST *assert : ast->asserts) {
                desugar(assert, obj_level + 1);
            }

        } else if (auto *ast = dynamic_cast<Object *>(ast_)) {
            ast_ = makeObject(ast, obj_level);

        } else if (auto *ast = dynamic_cast<ObjectComprehension *>(ast_)) {
            ast_ = makeObjectComprehension(ast, obj_level);

        } else if (auto *ast = dynamic_cast<ObjectComprehensionSimple *>(ast_)) {
            desugar(ast->field, obj_level);
            desugar(ast->value, obj_level + 1);
            desugar(ast->array, obj_level);

        } else if (auto *ast = dynamic_cast<Parens *>(ast_)) {
            // Strip parens.
            desugar(ast->expr, obj_level);
            ast_ = ast->expr;

        } else if (dynamic_cast<const Self *>(ast_)) {
            // Nothing to do.

        } else if (auto *ast = dynamic_cast<SuperIndex *>(ast_)) {
            if (ast->id != nullptr) {
                assert(ast->index == nullptr);
                ast->index = str(ast->id->name);
                ast->id = nullptr;
            }
            desugar(ast->index, obj_level);

        } else if (auto *ast = dynamic_cast<Unary *>(ast_)) {
            desugar(ast->expr, obj_level);

        } else if (dynamic_cast<const Var *>(ast_)) {
            // Nothing to do.

        } else {
            std::cerr << "INTERNAL ERROR: Unknown AST: " << ast_ << std::endl;
            std::abort();
        }
    }